

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O3

void __thiscall
QGraphicsProxyWidget::contextMenuEvent
          (QGraphicsProxyWidget *this,QGraphicsSceneContextMenuEvent *event)

{
  QGraphicsProxyWidgetPrivate *this_00;
  QObject *pQVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Reason RVar6;
  KeyboardModifiers KVar7;
  QWidget *this_01;
  QWidget *pQVar8;
  Data *pDVar9;
  long in_FS_OFFSET;
  double dVar10;
  double dVar11;
  QPoint globalPos;
  QContextMenuEvent contextMenuEvent;
  Data *local_a0;
  undefined8 local_98;
  QPoint local_90;
  QPointF local_88;
  QPoint local_78;
  undefined8 uStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (event == (QGraphicsSceneContextMenuEvent *)0x0) goto LAB_005fa750;
  this_00 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  pDVar9 = (this_00->widget).wp.d;
  if ((((pDVar9 == (Data *)0x0) || (*(int *)(pDVar9 + 4) == 0)) ||
      (pQVar1 = (this_00->widget).wp.value, pQVar1 == (QObject *)0x0)) ||
     (((*(byte *)(*(long *)(pQVar1 + 0x20) + 9) & 0x80) == 0 ||
      (bVar5 = QGraphicsItem::hasFocus((QGraphicsItem *)(this + 0x10)), !bVar5))))
  goto LAB_005fa750;
  local_88 = QGraphicsSceneContextMenuEvent::pos(event);
  dVar10 = (double)((ulong)local_88.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_88.xp;
  bVar5 = 2147483647.0 < dVar10;
  if (dVar10 <= -2147483648.0) {
    dVar10 = -2147483648.0;
  }
  local_78.xp.m_i =
       (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar10);
  dVar10 = (double)((ulong)local_88.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_88.yp;
  bVar5 = 2147483647.0 < dVar10;
  if (dVar10 <= -2147483648.0) {
    dVar10 = -2147483648.0;
  }
  local_78.yp.m_i =
       (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar10);
  this_01 = QWidget::childAt((QWidget *)(this_00->widget).wp.value,&local_78);
  if ((this_01 == (QWidget *)0x0) ||
     (local_a0 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&this_01->super_QObject),
     local_a0 == (Data *)0x0)) {
    bVar5 = true;
    local_a0 = (Data *)0x0;
LAB_005fa4b7:
    pDVar9 = (this_00->widget).wp.d;
    this_01 = (QWidget *)(this_00->widget).wp.value;
    if (pDVar9 != (Data *)0x0) goto LAB_005fa4ca;
    bVar4 = true;
    pDVar9 = (Data *)0x0;
    pQVar8 = (QWidget *)0x0;
  }
  else {
    bVar5 = false;
    pDVar9 = local_a0;
    if (*(int *)(local_a0 + 4) == 0) goto LAB_005fa4b7;
LAB_005fa4ca:
    LOCK();
    *(int *)pDVar9 = *(int *)pDVar9 + 1;
    UNLOCK();
    bVar4 = false;
    pQVar8 = (QWidget *)0x0;
    if (*(int *)(pDVar9 + 4) != 0) {
      pQVar8 = this_01;
    }
  }
  local_88 = QGraphicsProxyWidgetPrivate::mapToReceiver(this_00,&local_88,pQVar8);
  local_90 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  dVar10 = (double)((ulong)local_88.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_88.xp;
  bVar2 = 2147483647.0 < dVar10;
  if (dVar10 <= -2147483648.0) {
    dVar10 = -2147483648.0;
  }
  local_78.xp.m_i =
       (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar10);
  dVar10 = (double)((ulong)local_88.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_88.yp;
  bVar2 = 2147483647.0 < dVar10;
  if (dVar10 <= -2147483648.0) {
    dVar10 = -2147483648.0;
  }
  local_78.yp.m_i =
       (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar10);
  local_90 = QWidget::mapToGlobal(this_01,&local_78);
  pQVar8 = this_01;
  if (*(int *)(pDVar9 + 4) != 0) {
    do {
      if (((pQVar8->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 0x20000000) != 0) {
        local_90 = QGraphicsSceneContextMenuEvent::screenPos(event);
        break;
      }
      pQVar8 = *(QWidget **)(*(long *)&pQVar8->field_0x8 + 0x10);
    } while (pQVar8 != (QWidget *)0x0);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  uStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  RVar6 = QGraphicsSceneContextMenuEvent::reason(event);
  dVar10 = (double)((ulong)local_88.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_88.xp;
  bVar2 = 2147483647.0 < dVar10;
  if (dVar10 <= -2147483648.0) {
    dVar10 = -2147483648.0;
  }
  dVar11 = (double)((ulong)local_88.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_88.yp;
  bVar3 = 2147483647.0 < dVar11;
  if (dVar11 <= -2147483648.0) {
    dVar11 = -2147483648.0;
  }
  local_98 = CONCAT44((int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar3 & (ulong)dVar11),
                      (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar2 & (ulong)dVar10));
  KVar7 = QGraphicsSceneContextMenuEvent::modifiers(event);
  QContextMenuEvent::QContextMenuEvent
            ((QContextMenuEvent *)&local_78,RVar6,&local_98,&local_90,
             KVar7.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
             super_QFlagsStorage<Qt::KeyboardModifier>.i);
  puStack_60 = (undefined1 *)QGraphicsSceneEvent::timestamp(&event->super_QGraphicsSceneEvent);
  if (bVar4) {
    this_01 = (QWidget *)0x0;
  }
  else if (*(int *)(pDVar9 + 4) == 0) {
    this_01 = (QWidget *)0x0;
  }
  QCoreApplication::sendEvent(&this_01->super_QObject,(QEvent *)&local_78);
  (**(code **)(*(long *)&event->super_QGraphicsSceneEvent + 0x10))(event,uStack_70._4_1_);
  QContextMenuEvent::~QContextMenuEvent((QContextMenuEvent *)&local_78);
  if (!bVar4) {
    LOCK();
    *(int *)pDVar9 = *(int *)pDVar9 + -1;
    UNLOCK();
    if (*(int *)pDVar9 == 0) {
      operator_delete(pDVar9);
    }
  }
  if (!bVar5) {
    LOCK();
    *(int *)local_a0 = *(int *)local_a0 + -1;
    UNLOCK();
    if (*(int *)local_a0 == 0) {
      operator_delete(local_a0);
    }
  }
LAB_005fa750:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::contextMenuEvent(QGraphicsSceneContextMenuEvent *event)
{
    Q_D(QGraphicsProxyWidget);
    if (!event || !d->widget || !d->widget->isVisible() || !hasFocus())
        return;

    // Find widget position and receiver.
    QPointF pos = event->pos();
    QPointer<QWidget> alienWidget = d->widget->childAt(pos.toPoint());
    QPointer<QWidget> receiver =  alienWidget ? alienWidget : d->widget;

    // Map event position from us to the receiver
    pos = d->mapToReceiver(pos, receiver);

    QPoint globalPos = receiver->mapToGlobal(pos.toPoint());
    //If the receiver by-pass the proxy its popups
    //will be top level QWidgets therefore they need
    //the screen position. mapToGlobal expect the widget to
    //have proper coordinates in regards of the windowing system
    //but it's not true because the widget is embedded.
    if (bypassGraphicsProxyWidget(receiver))
        globalPos = event->screenPos();

    // Send mouse event. ### Doesn't propagate the event.
    QContextMenuEvent contextMenuEvent(QContextMenuEvent::Reason(event->reason()),
                                       pos.toPoint(), globalPos, event->modifiers());
    contextMenuEvent.setTimestamp(event->timestamp());
    QCoreApplication::sendEvent(receiver, &contextMenuEvent);

    event->setAccepted(contextMenuEvent.isAccepted());
}